

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

void __thiscall
ctemplate::SnippetEscape::Modify
          (SnippetEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  _func_int **pp_Var7;
  undefined8 uVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  long lVar12;
  UnclosedSnippetTags unclosed;
  byte abStack_3d [9];
  uint local_34;
  
  local_34 = 0;
  abStack_3d[1] = 0;
  abStack_3d[2] = 0;
  abStack_3d[3] = 0;
  abStack_3d[4] = 0;
  abStack_3d[5] = 0;
  if (0 < (long)inlen) {
    pbVar11 = (byte *)(in + inlen);
    pbVar10 = (byte *)in;
    do {
      while( true ) {
        bVar2 = *pbVar10;
        lVar5 = 1;
        if (0x26 < bVar2) break;
        if (bVar2 - 9 < 5) {
          if (in < pbVar10) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar10 - (long)in);
          }
          pp_Var7 = out->_vptr_ExpandEmitter;
          uVar8 = 1;
          pcVar6 = " ";
        }
        else if (bVar2 == 0x22) {
          if (in < pbVar10) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar10 - (long)in);
          }
          pp_Var7 = out->_vptr_ExpandEmitter;
          uVar8 = 6;
          pcVar6 = "&quot;";
        }
        else {
          if (bVar2 != 0x26) goto LAB_0012ae93;
          if (in < pbVar10) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar10 - (long)in);
          }
          if ((pbVar10 + 1 < pbVar11) && (pbVar10[1] == 0x7b)) {
            pp_Var7 = out->_vptr_ExpandEmitter;
            uVar8 = 5;
            pcVar6 = "&amp;";
          }
          else {
            pp_Var7 = out->_vptr_ExpandEmitter;
            uVar8 = 1;
            pcVar6 = "&";
          }
        }
LAB_0012af43:
        (*pp_Var7[5])(out,pcVar6,uVar8);
        in = (char *)(pbVar10 + 1);
        pbVar10 = (byte *)in;
        if (pbVar11 <= in) goto LAB_0012afa8;
      }
      if (bVar2 != 0x3c) {
        if (bVar2 == 0x27) {
          if (in < pbVar10) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar10 - (long)in);
          }
          pp_Var7 = out->_vptr_ExpandEmitter;
          uVar8 = 5;
          pcVar6 = "&#39;";
        }
        else {
          if (bVar2 != 0x3e) goto LAB_0012ae93;
          if (in < pbVar10) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar10 - (long)in);
          }
          pp_Var7 = out->_vptr_ExpandEmitter;
          uVar8 = 4;
          pcVar6 = "&gt;";
        }
        goto LAB_0012af43;
      }
      pbVar1 = pbVar10 + 1;
      uVar9 = (int)pbVar11 - (int)pbVar1;
      if ((int)uVar9 < 2) {
LAB_0012ada7:
        if (in < pbVar10) {
          (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar10 - (long)in);
        }
        pp_Var7 = out->_vptr_ExpandEmitter;
        uVar8 = 4;
        pcVar6 = "&lt;";
        goto LAB_0012af43;
      }
      if ((*(short *)pbVar1 == 0x3e62) &&
         (pcVar6 = strchr((char *)(abStack_3d + 1),0x62), pcVar6 == (char *)0x0)) {
        lVar5 = (long)(int)local_34;
        local_34 = local_34 + 1;
        abStack_3d[lVar5 + 1] = 0x62;
LAB_0012ae2e:
        lVar5 = 3;
      }
      else {
        if ((*(short *)pbVar1 == 0x3e69) &&
           (pcVar6 = strchr((char *)(abStack_3d + 1),0x69), pcVar6 == (char *)0x0)) {
          lVar5 = (long)(int)local_34;
          local_34 = local_34 + 1;
          abStack_3d[lVar5 + 1] = 0x69;
          goto LAB_0012ae2e;
        }
        if (uVar9 == 2) goto LAB_0012ada7;
        if ((pbVar10[3] == 0x3e && *(short *)pbVar1 == 0x6d65) &&
           (pcVar6 = strchr((char *)(abStack_3d + 1),0x65), pcVar6 == (char *)0x0)) {
          lVar5 = (long)(int)local_34;
          local_34 = local_34 + 1;
          abStack_3d[lVar5 + 1] = 0x65;
LAB_0012ae8e:
          lVar5 = 4;
        }
        else {
          if (((uVar9 < 0xd) || (pbVar10[9] != 0x3d || *(long *)pbVar1 != 0x726964206e617073)) ||
             (((*(int *)(pbVar10 + 10) != 0x3e72746c && (*(int *)(pbVar10 + 10) != 0x3e6c7472)) ||
              (pcVar6 = strchr((char *)(abStack_3d + 1),0x73), pcVar6 != (char *)0x0)))) {
            if ((pbVar10[3] == 0x3e && *(short *)pbVar1 == 0x622f) &&
               (pcVar6 = strchr((char *)(abStack_3d + 1),0x62), pcVar6 != (char *)0x0)) {
              cVar3 = *pcVar6;
              while (cVar3 != '\0') {
                cVar3 = pcVar6[1];
                *pcVar6 = cVar3;
                pcVar6 = pcVar6 + 1;
              }
            }
            else {
              if ((pbVar10[3] != 0x3e || *(short *)pbVar1 != 0x692f) ||
                 (pcVar6 = strchr((char *)(abStack_3d + 1),0x69), pcVar6 == (char *)0x0)) {
                if (uVar9 < 4) {
                  lVar5 = 4;
                  if (pbVar10[3] != 0x3e || *(short *)pbVar1 != 0x7262) goto LAB_0012ada7;
                }
                else if ((*(int *)pbVar1 == 0x3e6d652f) &&
                        (pcVar6 = strchr((char *)(abStack_3d + 1),0x65), pcVar6 != (char *)0x0)) {
                  cVar3 = *pcVar6;
                  while (cVar3 != '\0') {
                    cVar3 = pcVar6[1];
                    *pcVar6 = cVar3;
                    pcVar6 = pcVar6 + 1;
                  }
                  local_34 = local_34 - 1;
                  lVar5 = 5;
                }
                else if ((uVar9 < 6) ||
                        ((*(short *)(pbVar10 + 5) != 0x3e6e || *(int *)pbVar1 != 0x6170732f ||
                         (pcVar6 = strchr((char *)(abStack_3d + 1),0x73), pcVar6 == (char *)0x0))))
                {
                  if (pbVar10[3] == 0x3e && *(short *)pbVar1 == 0x7262) goto LAB_0012ae8e;
                  if ((uVar9 < 4) || (lVar5 = 5, *(int *)pbVar1 != 0x3e726277)) goto LAB_0012ada7;
                }
                else {
                  cVar3 = *pcVar6;
                  while (cVar3 != '\0') {
                    cVar3 = pcVar6[1];
                    *pcVar6 = cVar3;
                    pcVar6 = pcVar6 + 1;
                  }
                  local_34 = local_34 - 1;
                  lVar5 = 7;
                }
                goto LAB_0012ae93;
              }
              cVar3 = *pcVar6;
              while (cVar3 != '\0') {
                cVar3 = pcVar6[1];
                *pcVar6 = cVar3;
                pcVar6 = pcVar6 + 1;
              }
            }
            local_34 = local_34 - 1;
            goto LAB_0012ae8e;
          }
          lVar5 = (long)(int)local_34;
          local_34 = local_34 + 1;
          abStack_3d[lVar5 + 1] = 0x73;
          lVar5 = 0xe;
        }
      }
LAB_0012ae93:
      pbVar10 = pbVar10 + lVar5;
    } while (pbVar10 < pbVar11);
    if (in < pbVar10) {
      (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar10 - (long)in);
    }
LAB_0012afa8:
    if ((int)local_34 < 0) {
      return;
    }
  }
  lVar5 = (ulong)local_34 + 1;
  do {
    bVar2 = abStack_3d[lVar5];
    if (bVar2 < 0x69) {
      pcVar6 = "</b>";
      if (bVar2 == 0x62) goto LAB_0012b001;
      if (bVar2 == 0x65) {
        pcVar6 = "</em>";
        goto LAB_0012b001;
      }
    }
    else {
      if (bVar2 == 0x73) {
        pcVar6 = "</span>";
      }
      else {
        if (bVar2 != 0x69) goto LAB_0012b00a;
        pcVar6 = "</i>";
      }
LAB_0012b001:
      (*out->_vptr_ExpandEmitter[4])(out,pcVar6);
    }
LAB_0012b00a:
    lVar12 = lVar5 + -1;
    bVar4 = lVar5 < 1;
    lVar5 = lVar12;
    if (lVar12 == 0 || bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void SnippetEscape::Modify(const char* in, size_t inlen,
                           const PerExpandData*,
                           ExpandEmitter* out, const string& arg) const {
  UnclosedSnippetTags unclosed;
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit) {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      case '<': {
        // If there is a permissible tag, just advance pos past it to
        // make it part of the current run.  Notice the use of
        // "continue" below.
        const char* const next_pos = pos + 1;
        const int chars_left = limit - next_pos;
        if ((chars_left >= 2) && !memcmp(next_pos, "b>", 2)
            && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_B)) {
          pos += strliterallen("<b>");
          continue;
        } else if ((chars_left >= 2) && !memcmp(next_pos, "i>", 2)
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_I)) {
          pos += strliterallen("<i>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "em>", 3)
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_EM)) {
          pos += strliterallen("<em>");
          continue;
        } else if ((chars_left >= 13) && !memcmp(next_pos, "span dir=", 9)
                   && (!memcmp(next_pos + 9, "ltr>", 4) ||
                       !memcmp(next_pos + 9, "rtl>", 4))
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_SPAN)) {
          pos += strliterallen("<span dir=ltr>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "/b>", 3)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_B)) {
          pos += strliterallen("</b>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "/i>", 3)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_I)) {
          pos += strliterallen("</i>");
          continue;
        } else if ((chars_left >= 4) && !memcmp(next_pos, "/em>", 4)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_EM)) {
          pos += strliterallen("</em>");
          continue;
        } else if ((chars_left >= 6) && !memcmp(next_pos, "/span>", 6)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_SPAN)) {
          pos += strliterallen("</span>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "br>", 3)) {
          pos += strliterallen("<br>");
          continue;
        } else if ((chars_left >= 4) && !memcmp(next_pos, "wbr>", 4)) {
          pos += strliterallen("<wbr>");
          continue;
        }

        // Emit the entity and break out of the switch.
        EmitRun(start, pos, out);
        APPEND("&lt;");
        break;
      }

      case '&':
        EmitRun(start, pos, out);
        if (pos + 1 < limit && pos[1] == '{') {
          // Could be a javascript entity, so we need to escape.
          // (Javascript entities are an xss risk in Netscape 4.)
          APPEND("&amp;");
        } else {
          APPEND("&");
        }
        break;

      case '"':  EmitRun(start, pos, out); APPEND("&quot;"); break;
      case '\'': EmitRun(start, pos, out); APPEND("&#39;");  break;
      case '>':  EmitRun(start, pos, out); APPEND("&gt;");   break;

      case '\r': case '\n': case '\v': case '\f': case '\t':
        // non-space whitespace
        EmitRun(start, pos, out); APPEND(" "); break;

    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
  unclosed.PrintClosingTags(out);
}